

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O2

void __thiscall flexbuffers::Builder::Bool(Builder *this,bool b)

{
  undefined7 in_register_00000031;
  anon_union_8_3_83789bcb_for_Value_0 local_10;
  undefined8 local_8;
  
  local_10.u_ = CONCAT71(in_register_00000031,b) & 0xffffffff;
  local_8 = 0x1a;
  std::vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>::
  emplace_back<flexbuffers::Builder::Value>(&this->stack_,(Value *)&local_10);
  return;
}

Assistant:

void Bool(bool b) { stack_.push_back(Value(b)); }